

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O1

void __thiscall ADPlanner::BuildNewOPENList(ADPlanner *this,ADSearchStateSpace_t *pSearchStateSpace)

{
  CList *this_00;
  CHeap *this_01;
  AbstractSearchState *AbstractSearchState;
  listelement *plVar1;
  CKey local_60;
  CKey local_50;
  long local_40;
  long local_38;
  
  this_00 = pSearchStateSpace->inconslist;
  plVar1 = this_00->firstelement;
  if (plVar1 != (listelement *)0x0) {
    this_01 = pSearchStateSpace->heap;
    do {
      AbstractSearchState = plVar1->liststate;
      (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x36])(&local_40,this,AbstractSearchState);
      if (AbstractSearchState->heapindex == 0) {
        local_50.key[0] = local_40;
        local_50.key[1] = local_38;
        CHeap::insertheap(this_01,AbstractSearchState,&local_50);
      }
      else {
        local_60.key[0] = local_40;
        local_60.key[1] = local_38;
        CHeap::updateheap(this_01,AbstractSearchState,&local_60);
      }
      CList::remove(this_00,(char *)AbstractSearchState);
      plVar1 = this_00->firstelement;
    } while (plVar1 != (listelement *)0x0);
  }
  pSearchStateSpace->bRebuildOpenList = false;
  return;
}

Assistant:

void ADPlanner::BuildNewOPENList(ADSearchStateSpace_t* pSearchStateSpace)
{
    ADState *state;
    CKey key;
    CHeap* pheap = pSearchStateSpace->heap;
    CList* pinconslist = pSearchStateSpace->inconslist;

    //move incons into open
    while (pinconslist->firstelement != NULL) {
        state = (ADState*)pinconslist->firstelement->liststate;

        //compute f-value
        key = ComputeKey(state);

        //insert into OPEN
        if (state->heapindex == 0)
            pheap->insertheap(state, key);
        else
            pheap->updateheap(state, key); //should never happen, but sometimes it does - somewhere there is a bug TODO
        //remove from INCONS
        pinconslist->remove(state, AD_INCONS_LIST_ID);
    }

    pSearchStateSpace->bRebuildOpenList = false;
}